

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__get16le(stbi__context *s)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  
  pbVar2 = s->img_buffer;
  pbVar3 = s->img_buffer_end;
  if (pbVar2 < pbVar3) {
LAB_0013fc11:
    s->img_buffer = pbVar2 + 1;
    uVar4 = (uint)*pbVar2;
    pbVar2 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
      pbVar3 = s->img_buffer_end;
      goto LAB_0013fc11;
    }
    uVar4 = 0;
  }
  if (pbVar3 <= pbVar2) {
    if (s->read_from_callbacks == 0) {
      uVar1 = 0;
      goto LAB_0013fc4d;
    }
    stbi__refill_buffer(s);
    pbVar2 = s->img_buffer;
  }
  s->img_buffer = pbVar2 + 1;
  uVar1 = (uint)*pbVar2 << 8;
LAB_0013fc4d:
  return uVar1 | uVar4;
}

Assistant:

static int stbi__get16le(stbi__context *s)
{
   int z = stbi__get8(s);
   return z + (stbi__get8(s) << 8);
}